

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::handleBracketDereference
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *base,TIntermTyped *index)

{
  TIntermConstantUnion *node;
  char cVar1;
  bool bVar2;
  int iVar3;
  TIntermTyped *pTVar4;
  TIntermTyped *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TIntermConstantUnion *pTVar7;
  char *pcVar8;
  TOperator op;
  TIntermediate *this_00;
  _func_int **pp_Var9;
  int indexValue;
  TType newType;
  int local_cc;
  TIntermConstantUnion *local_c8;
  TType local_c0;
  
  local_c8 = (TIntermConstantUnion *)base;
  pTVar4 = makeIntegerIndex(this,index);
  if (pTVar4 == (TIntermTyped *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc," unknown index type ","","");
    return (TIntermTyped *)0x0;
  }
  pTVar5 = handleBracketOperator(this,loc,base,pTVar4);
  if (pTVar5 != (TIntermTyped *)0x0) {
    return pTVar5;
  }
  local_cc = 0;
  iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar4);
  if ((*(ulong *)(CONCAT44(extraout_var,iVar3) + 8) & 0x10000007f) == 2) {
    iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[5])(pTVar4);
    local_cc = **(int **)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0xc0) + 8);
  }
  variableCheck(this,(TIntermTyped **)&local_c8);
  node = local_c8;
  iVar3 = (*(local_c8->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x2a])(local_c8);
  if ((((char)iVar3 == '\0') &&
      (iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x29])(node),
      (char)iVar3 == '\0')) &&
     (iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x2b])(node),
     (char)iVar3 == '\0')) {
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(node);
    if (CONCAT44(extraout_var_13,iVar3) == 0) {
      pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "expression";
    }
    else {
      iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(node);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar3) + 400))
                        ((long *)CONCAT44(extraout_var_14,iVar3));
      pcVar8 = *(char **)(lVar6 + 8);
      pp_Var9 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    }
    pTVar7 = (TIntermConstantUnion *)0x0;
    (*pp_Var9[0x2d])(this,loc," left of \'[\' is not of type array, matrix, or vector ",pcVar8,"");
  }
  else {
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var_01,iVar3));
    if (((*(ulong *)(lVar6 + 8) & 0x10000007f) == 2) &&
       (iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar4),
       (*(ulong *)(CONCAT44(extraout_var_02,iVar3) + 8) & 0x10000007f) == 2)) {
      iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      TParseContextBase::checkIndex
                (&this->super_TParseContextBase,loc,(TType *)CONCAT44(extraout_var_03,iVar3),
                 &local_cc);
      pTVar4 = TIntermediate::foldDereference
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          &node->super_TIntermTyped,local_cc,loc);
      return pTVar4;
    }
    iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar4);
    if ((*(ulong *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0x10000007f) == 2) {
      iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      TParseContextBase::checkIndex
                (&this->super_TParseContextBase,loc,(TType *)CONCAT44(extraout_var_05,iVar3),
                 &local_cc);
    }
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 200))
                      ((long *)CONCAT44(extraout_var_06,iVar3));
    if (cVar1 != '\0') {
      bVar2 = false;
      pTVar7 = node;
      goto LAB_0038066b;
    }
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(node);
    if ((CONCAT44(extraout_var_07,iVar3) != 0) &&
       (bVar2 = wasFlattened(this,&node->super_TIntermTyped), bVar2)) {
      iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar4);
      if ((*(uint *)(CONCAT44(extraout_var_08,iVar3) + 8) & 0x7f) != 2) {
        iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(node);
        lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 400))
                          ((long *)CONCAT44(extraout_var_09,iVar3));
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"Invalid variable index to flattened array",*(undefined8 *)(lVar6 + 8),
                   "");
      }
      pTVar7 = (TIntermConstantUnion *)flattenAccess(this,&node->super_TIntermTyped,local_cc);
      bVar2 = pTVar7 != node;
      goto LAB_0038066b;
    }
    iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar4);
    if ((*(ulong *)(CONCAT44(extraout_var_10,iVar3) + 8) & 0x10000007f) == 2) {
      iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0xf8))
                        ((long *)CONCAT44(extraout_var_11,iVar3));
      pp_Var9 = (node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
      if (cVar1 == '\0') {
        iVar3 = (*pp_Var9[0x1e])(node);
        TParseContextBase::checkIndex
                  (&this->super_TParseContextBase,loc,(TType *)CONCAT44(extraout_var_15,iVar3),
                   &local_cc);
      }
      else {
        iVar3 = (*pp_Var9[0x1f])();
        (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar3) + 0x118))
                  ((long *)CONCAT44(extraout_var_12,iVar3),local_cc + 1);
      }
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      op = EOpIndexDirect;
    }
    else {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      op = EOpIndexIndirect;
    }
    pTVar7 = (TIntermConstantUnion *)
             TIntermediate::addIndex(this_00,op,&node->super_TIntermTyped,pTVar4,loc);
  }
  bVar2 = false;
LAB_0038066b:
  if (pTVar7 == (TIntermConstantUnion *)0x0) {
    pTVar7 = TIntermediate::addConstantUnion
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,
                        EbtFloat,loc,false);
  }
  else if (!bVar2) {
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    TType::TType(&local_c0,(TType *)CONCAT44(extraout_var_16,iVar3),0,false);
    iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar3) + 0x58))
                      ((long *)CONCAT44(extraout_var_17,iVar3));
    if (((*(uint *)(lVar6 + 8) & 0x7f) == 2) &&
       (iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar4),
       (*(uint *)(CONCAT44(extraout_var_18,iVar3) + 8) & 0x7f) == 2)) {
      local_c0.qualifier._8_8_ = local_c0.qualifier._8_8_ & 0xffffffffffffff80 | 2;
    }
    else {
      local_c0.qualifier._8_8_ = local_c0.qualifier._8_8_ & 0xffffffffffffff80;
    }
    (*(pTVar7->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(pTVar7,&local_c0);
  }
  return &pTVar7->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::handleBracketDereference(const TSourceLoc& loc, TIntermTyped* base, TIntermTyped* index)
{
    index = makeIntegerIndex(index);

    if (index == nullptr) {
        error(loc, " unknown index type ", "", "");
        return nullptr;
    }

    TIntermTyped* result = handleBracketOperator(loc, base, index);

    if (result != nullptr)
        return result;  // it was handled as an operator[]

    bool flattened = false;
    int indexValue = 0;
    if (index->getQualifier().isFrontEndConstant())
        indexValue = index->getAsConstantUnion()->getConstArray()[0].getIConst();

    variableCheck(base);
    if (! base->isArray() && ! base->isMatrix() && ! base->isVector()) {
        if (base->getAsSymbolNode())
            error(loc, " left of '[' is not of type array, matrix, or vector ",
                  base->getAsSymbolNode()->getName().c_str(), "");
        else
            error(loc, " left of '[' is not of type array, matrix, or vector ", "expression", "");
    } else if (base->getType().getQualifier().isFrontEndConstant() &&
               index->getQualifier().isFrontEndConstant()) {
        // both base and index are front-end constants
        checkIndex(loc, base->getType(), indexValue);
        return intermediate.foldDereference(base, indexValue, loc);
    } else {
        // at least one of base and index is variable...

        if (index->getQualifier().isFrontEndConstant())
            checkIndex(loc, base->getType(), indexValue);

        if (base->getType().isScalarOrVec1())
            result = base;
        else if (base->getAsSymbolNode() && wasFlattened(base)) {
            if (index->getQualifier().storage != EvqConst)
                error(loc, "Invalid variable index to flattened array", base->getAsSymbolNode()->getName().c_str(), "");

            result = flattenAccess(base, indexValue);
            flattened = (result != base);
        } else {
            if (index->getQualifier().isFrontEndConstant()) {
                if (base->getType().isUnsizedArray())
                    base->getWritableType().updateImplicitArraySize(indexValue + 1);
                else
                    checkIndex(loc, base->getType(), indexValue);
                result = intermediate.addIndex(EOpIndexDirect, base, index, loc);
            } else
                result = intermediate.addIndex(EOpIndexIndirect, base, index, loc);
        }
    }

    if (result == nullptr) {
        // Insert dummy error-recovery result
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);
    } else {
        // If the array reference was flattened, it has the correct type.  E.g, if it was
        // a uniform array, it was flattened INTO a set of scalar uniforms, not scalar temps.
        // In that case, we preserve the qualifiers.
        if (!flattened) {
            // Insert valid dereferenced result
            TType newType(base->getType(), 0);  // dereferenced type
            if (base->getType().getQualifier().storage == EvqConst && index->getQualifier().storage == EvqConst)
                newType.getQualifier().storage = EvqConst;
            else
                newType.getQualifier().storage = EvqTemporary;
            result->setType(newType);
        }
    }

    return result;
}